

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

QString * QInputDialog::getText
                    (QString *__return_storage_ptr__,QWidget *parent,QString *title,QString *label,
                    EchoMode mode,QString *text,bool *ok,WindowFlags flags,
                    InputMethodHints inputMethodHints)

{
  bool bVar1;
  int iVar2;
  QInputDialog *this;
  long in_FS_OFFSET;
  QAutoPointer<QInputDialog> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QInputDialog *)operator_new(0x28);
  QInputDialog(this,parent,flags);
  QPointer<QInputDialog>::QPointer<void>(&local_48.o,this);
  QWidget::setWindowTitle((QWidget *)local_48.o.wp.value,title);
  setLabelText((QInputDialog *)local_48.o.wp.value,label);
  setTextValue((QInputDialog *)local_48.o.wp.value,text);
  setTextEchoMode((QInputDialog *)local_48.o.wp.value,mode);
  QWidget::setInputMethodHints((QWidget *)local_48.o.wp.value,inputMethodHints);
  iVar2 = (**(code **)(*(long *)local_48.o.wp.value + 0x1a8))();
  if (ok != (bool *)0x0) {
    *ok = iVar2 != 0;
  }
  bVar1 = QAutoPointer::operator_cast_to_bool((QAutoPointer *)&local_48);
  if (iVar2 == 0 || !bVar1) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    textValue(__return_storage_ptr__,(QInputDialog *)local_48.o.wp.value);
  }
  QAutoPointer<QInputDialog>::~QAutoPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QInputDialog::getText(QWidget *parent, const QString &title, const QString &label,
                              QLineEdit::EchoMode mode, const QString &text, bool *ok,
                              Qt::WindowFlags flags, Qt::InputMethodHints inputMethodHints)
{
    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setTextValue(text);
    dialog->setTextEchoMode(mode);
    dialog->setInputMethodHints(inputMethodHints);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->textValue();
    } else {
        return QString();
    }
}